

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O1

log_entry * __thiscall log_queue::pop_top(log_queue *this)

{
  _Map_pointer ppplVar1;
  _Elt_pointer pplVar2;
  log_entry *plVar3;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->queue_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  while ((ppplVar1 = (this->queue).c.
                     super__Deque_base<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node,
         pplVar2 = (this->queue).c.
                   super__Deque_base<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur,
         ((long)(this->queue).c.
                super__Deque_base<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>.
                _M_impl.super__Deque_impl_data._M_start._M_last - (long)pplVar2 >> 3) +
         ((long)(this->queue).c.
                super__Deque_base<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur -
          (long)(this->queue).c.
                super__Deque_base<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
         ((((ulong)((long)ppplVar1 -
                   (long)(this->queue).c.
                         super__Deque_base<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
         (ulong)(ppplVar1 == (_Map_pointer)0x0)) * 0x40 == 0 && (this->active == true))) {
    std::condition_variable::wait((unique_lock *)&this->wait_for_next_item_condition);
  }
  if (this->active == true) {
    plVar3 = *pplVar2;
    std::deque<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>::pop_front
              ((deque<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_> *)this);
  }
  else {
    plVar3 = (log_entry *)0x0;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return plVar3;
}

Assistant:

log_entry* pop_top() {
            std::unique_lock<std::mutex> lock(queue_mutex);
            while ((queue.size() == 0) && (active == true)) {
                wait_for_next_item_condition.wait(lock);
            }

            if (!active) {
                return nullptr;
            }

            log_entry* top = queue.front();
            queue.pop();
            return top;
        }